

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O1

mz_bool mz_zip_writer_add_file
                  (mz_zip_archive *pZip,char *pArchive_name,char *pSrc_filename,void *pComment,
                  mz_uint16 comment_size,mz_uint level_and_flags)

{
  char cVar1;
  mz_uint mVar2;
  bool bVar3;
  mz_uint16 method;
  mz_uint16 mVar4;
  size_t sVar5;
  undefined1 uVar6;
  mz_bool mVar7;
  tdefl_status tVar8;
  char *pcVar9;
  FILE *__stream;
  void *pvVar10;
  size_t sVar11;
  mz_uint8 *pmVar12;
  ulong uVar13;
  void *pvVar14;
  long lVar15;
  mz_uint64 mVar16;
  void *pvVar17;
  ushort uVar18;
  uint uVar19;
  mz_uint16 dos_date_00;
  mz_ulong uncomp_size;
  mz_uint16 dos_date;
  mz_uint16 dos_time;
  ulong local_b0;
  void *local_a8;
  mz_uint8 *local_a0;
  int local_94;
  size_t local_90;
  tdefl_compressor *local_88;
  mz_uint64 local_80;
  undefined8 local_78;
  undefined1 uStack_70;
  undefined1 uStack_6f;
  undefined1 uStack_6e;
  undefined1 uStack_6d;
  undefined1 uStack_6c;
  undefined1 uStack_6b;
  undefined1 uStack_6a;
  undefined1 uStack_69;
  undefined1 uStack_68;
  undefined1 uStack_67;
  undefined1 uStack_66;
  undefined1 uStack_65;
  undefined1 uStack_64;
  undefined1 uStack_63;
  ulong uStack_62;
  ulong local_58;
  void *local_50;
  mz_zip_writer_add_state state;
  
  dos_time = 0;
  dos_date = 0;
  uVar19 = 6;
  if (-1 < (int)level_and_flags) {
    uVar19 = level_and_flags;
  }
  if (pZip->m_pState == (mz_zip_internal_state *)0x0) {
    return 0;
  }
  if (pArchive_name == (char *)0x0) {
    return 0;
  }
  if (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING) {
    return 0;
  }
  if ((uVar19 >> 10 & 1) != 0) {
    return 0;
  }
  if (pComment == (void *)0x0 && comment_size != 0) {
    return 0;
  }
  if (10 < (uVar19 & 0xf)) {
    return 0;
  }
  if (*pArchive_name == '/') {
    return 0;
  }
  mVar16 = pZip->m_archive_size;
  for (pcVar9 = pArchive_name; cVar1 = *pcVar9, cVar1 != '\0'; pcVar9 = pcVar9 + 1) {
    if (cVar1 == ':') {
      return 0;
    }
    if (cVar1 == '\\') {
      return 0;
    }
  }
  local_50 = pComment;
  local_90 = strlen(pArchive_name);
  if (0xffff < local_90) {
    return 0;
  }
  if (pZip->m_total_files == 0xffff) {
    return 0;
  }
  mVar2 = pZip->m_file_offset_alignment;
  local_b0 = (ulong)(mVar2 - ((uint)mVar16 & mVar2 - 1) & mVar2 - 1);
  if (mVar2 == 0) {
    local_b0 = 0;
  }
  local_80 = mVar16 + local_b0;
  local_58 = (ulong)comment_size;
  if (local_90 + local_58 + local_80 + 0x4c >> 0x20 != 0) {
    return 0;
  }
  mVar7 = (anonymous_namespace)::miniz::mz_zip_get_file_modified_time
                    (pSrc_filename,&dos_time,&dos_date);
  if (mVar7 == 0) {
    return 0;
  }
  __stream = fopen64(pSrc_filename,"rb");
  if (__stream == (FILE *)0x0) {
    return 0;
  }
  fseeko64(__stream,0,2);
  pvVar10 = (void *)ftello64(__stream);
  fseeko64(__stream,0,0);
  if ((ulong)pvVar10 >> 0x20 != 0) {
    fclose(__stream);
    return 0;
  }
  uVar19 = uVar19 & 0xf;
  if (pvVar10 < (void *)0x4) {
    uVar19 = 0;
  }
  lVar15 = local_b0 + 0x1e;
  local_a8 = pvVar10;
  mVar7 = (anonymous_namespace)::miniz::mz_zip_writer_write_zeros(pZip,mVar16,(mz_uint32)lVar15);
  sVar5 = local_90;
  if (mVar7 != 0) {
    if ((pZip->m_file_offset_alignment != 0) &&
       (((uint)local_80 & pZip->m_file_offset_alignment - 1) != 0)) {
      __assert_fail("(local_dir_header_ofs & (pZip->m_file_offset_alignment - 1)) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/stanford-cs248[P]shading/CS248/include/CS248/tinyexr.h"
                    ,0x1864,
                    "mz_bool (anonymous namespace)::miniz::mz_zip_writer_add_file(mz_zip_archive *, const char *, const char *, const void *, mz_uint16, mz_uint)"
                   );
    }
    mVar16 = lVar15 + mVar16;
    uStack_68 = 0;
    uStack_67 = 0;
    uStack_66 = 0;
    uStack_65 = 0;
    uStack_64 = 0;
    uStack_63 = 0;
    uStack_62 = 0;
    local_78 = 0;
    uStack_70 = 0;
    uStack_6f = 0;
    uStack_6e = 0;
    uStack_6d = 0;
    uStack_6c = 0;
    uStack_6b = 0;
    uStack_6a = 0;
    uStack_69 = 0;
    sVar11 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,mVar16,pArchive_name,local_90);
    if (sVar11 == sVar5) {
      local_b0 = mVar16 + sVar5;
      pvVar10 = (void *)0x0;
      if (local_a8 == (void *)0x0) {
        uVar18 = 0;
        uncomp_size = 0;
      }
      else {
        pmVar12 = (mz_uint8 *)(*pZip->m_pAlloc)(pZip->m_pAlloc_opaque,1,0x10000);
        if (pmVar12 == (mz_uint8 *)0x0) {
          fclose(__stream);
          pvVar10 = (void *)0x0;
          bVar3 = false;
          uVar18 = 0;
          uncomp_size = 0;
        }
        else {
          local_a0 = pmVar12;
          if (uVar19 == 0) {
            uncomp_size = 0;
            pvVar10 = local_a8;
            do {
              if (pvVar10 == (void *)0x0) {
                uVar18 = 0;
                pvVar10 = local_a8;
                goto LAB_00175b13;
              }
              pvVar17 = (void *)0x10000;
              if (pvVar10 < (void *)0x10000) {
                pvVar17 = pvVar10;
              }
              pvVar14 = (void *)fread(pmVar12,1,(size_t)pvVar17,__stream);
              if ((pvVar14 == pvVar17) &&
                 (pvVar14 = (void *)(*pZip->m_pWrite)(pZip->m_pIO_opaque,local_b0,pmVar12,
                                                      (size_t)pvVar17), pvVar14 == pvVar17)) {
                uncomp_size = mz_crc32(uncomp_size & 0xffffffff,pmVar12,(size_t)pvVar17);
                pvVar10 = (void *)((long)pvVar10 - (long)pvVar17);
                local_b0 = local_b0 + (long)pvVar17;
                bVar3 = true;
              }
              else {
                (*pZip->m_pFree)(pZip->m_pAlloc_opaque,pmVar12);
                fclose(__stream);
                bVar3 = false;
              }
            } while (bVar3);
            pvVar10 = (void *)0x0;
            bVar3 = false;
            uVar18 = 0;
          }
          else {
            local_88 = (tdefl_compressor *)(*pZip->m_pAlloc)(pZip->m_pAlloc_opaque,1,0x4df78);
            if (local_88 == (tdefl_compressor *)0x0) {
              (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_a0);
              fclose(__stream);
              pvVar10 = (void *)0x0;
              bVar3 = false;
              uVar18 = 0;
              uncomp_size = 0;
            }
            else {
              state.m_cur_archive_file_ofs = local_b0;
              uVar13 = 10;
              if (uVar19 < 10) {
                uVar13 = (ulong)uVar19;
              }
              state.m_comp_size = 0;
              state.m_pZip = pZip;
              tdefl_init(local_88,(anonymous_namespace)::miniz::mz_zip_writer_add_put_buf_callback,
                         &state,(uint)(uVar19 < 4) << 0xe |
                                tdefl_write_image_to_png_file_in_memory_ex::s_tdefl_png_num_probes
                                [uVar13]);
              pmVar12 = local_a0;
              local_94 = 0;
              uncomp_size = 0;
              pvVar10 = local_a8;
              do {
                pvVar17 = (void *)0x10000;
                if (pvVar10 < (void *)0x10000) {
                  pvVar17 = pvVar10;
                }
                pvVar14 = (void *)fread(pmVar12,1,(size_t)pvVar17,__stream);
                if (pvVar14 == pvVar17) {
                  uncomp_size = mz_crc32(uncomp_size & 0xffffffff,pmVar12,(size_t)pvVar17);
                  pvVar10 = (void *)((long)pvVar10 - (long)pvVar17);
                  tVar8 = tdefl_compress_buffer
                                    (local_88,pmVar12,(size_t)pvVar17,
                                     (uint)(pvVar10 == (void *)0x0) << 2);
                  if (tVar8 == TDEFL_STATUS_OKAY) {
                    bVar3 = true;
                  }
                  else {
                    if (tVar8 != TDEFL_STATUS_DONE) goto LAB_00175994;
                    bVar3 = false;
                    local_94 = 1;
                  }
                }
                else {
LAB_00175994:
                  bVar3 = false;
                }
              } while (bVar3);
              (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_88);
              if (local_94 == 0) {
                (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_a0);
                fclose(__stream);
                pvVar10 = (void *)0x0;
                bVar3 = false;
                uVar18 = 0;
              }
              else {
                local_b0 = state.m_cur_archive_file_ofs;
                uVar18 = 8;
                bVar3 = true;
                pvVar10 = (void *)state.m_comp_size;
              }
            }
            if (bVar3) {
LAB_00175b13:
              (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_a0);
              bVar3 = true;
            }
            else {
              bVar3 = false;
            }
          }
        }
        if (!bVar3) {
          return 0;
        }
      }
      fclose(__stream);
      mVar4 = dos_time;
      method = dos_date;
      if ((ulong)pvVar10 >> 0x20 != 0) {
        return 0;
      }
      if (local_b0 >> 0x20 == 0) {
        uVar6 = 0x14;
        if (uVar18 == 0) {
          uVar6 = 0;
        }
        local_78 = (ulong)CONCAT14(uVar6,0x4034b50);
        uStack_70 = (undefined1)uVar18;
        uStack_6f = 0;
        uStack_6e = (undefined1)dos_time;
        uStack_6d = (undefined1)(dos_time >> 8);
        uStack_6c = (undefined1)dos_date;
        uStack_6b = (undefined1)(dos_date >> 8);
        uStack_6a = (undefined1)uncomp_size;
        uStack_69 = (undefined1)(uncomp_size >> 8);
        uStack_68 = (undefined1)(uncomp_size >> 0x10);
        uStack_67 = (undefined1)(uncomp_size >> 0x18);
        uStack_66 = SUB81(pvVar10,0);
        uStack_65 = (undefined1)((ulong)pvVar10 >> 8);
        uStack_64 = (undefined1)((ulong)pvVar10 >> 0x10);
        uStack_63 = (undefined1)((ulong)pvVar10 >> 0x18);
        uStack_62 = (ulong)CONCAT15((char)(local_90 >> 8),CONCAT14((char)local_90,(int)local_a8));
        dos_date_00 = 0x5c2e;
        sVar11 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,local_80,&local_78,0x1e);
        if (sVar11 == 0x1e) {
          mVar7 = (anonymous_namespace)::miniz::mz_zip_writer_add_to_central_dir
                            (pZip,pArchive_name,(mz_uint16)local_90,local_50,(mz_uint16)local_58,
                             local_a8,(mz_uint16)pvVar10,uncomp_size,(ulong)uVar18,(uint)mVar4,
                             method,(mz_uint16)local_80,0,dos_date_00,uncomp_size,(uint)mVar4);
          if (mVar7 != 0) {
            pZip->m_total_files = pZip->m_total_files + 1;
            pZip->m_archive_size = local_b0;
            return 1;
          }
          return 0;
        }
        return 0;
      }
      return 0;
    }
  }
  fclose(__stream);
  return 0;
}

Assistant:

mz_bool mz_zip_writer_add_file(mz_zip_archive *pZip, const char *pArchive_name,
                               const char *pSrc_filename, const void *pComment,
                               mz_uint16 comment_size,
                               mz_uint level_and_flags) {
  mz_uint uncomp_crc32 = MZ_CRC32_INIT, level, num_alignment_padding_bytes;
  mz_uint16 method = 0, dos_time = 0, dos_date = 0, ext_attributes = 0;
  mz_uint64 local_dir_header_ofs = pZip->m_archive_size,
            cur_archive_file_ofs = pZip->m_archive_size, uncomp_size = 0,
            comp_size = 0;
  size_t archive_name_size;
  mz_uint8 local_dir_header[MZ_ZIP_LOCAL_DIR_HEADER_SIZE];
  MZ_FILE *pSrc_file = NULL;

  if ((int)level_and_flags < 0)
    level_and_flags = MZ_DEFAULT_LEVEL;
  level = level_and_flags & 0xF;

  if ((!pZip) || (!pZip->m_pState) ||
      (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING) || (!pArchive_name) ||
      ((comment_size) && (!pComment)) || (level > MZ_UBER_COMPRESSION))
    return MZ_FALSE;
  if (level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA)
    return MZ_FALSE;
  if (!mz_zip_writer_validate_archive_name(pArchive_name))
    return MZ_FALSE;

  archive_name_size = strlen(pArchive_name);
  if (archive_name_size > 0xFFFF)
    return MZ_FALSE;

  num_alignment_padding_bytes =
      mz_zip_writer_compute_padding_needed_for_file_alignment(pZip);

  // no zip64 support yet
  if ((pZip->m_total_files == 0xFFFF) ||
      ((pZip->m_archive_size + num_alignment_padding_bytes +
        MZ_ZIP_LOCAL_DIR_HEADER_SIZE + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE +
        comment_size + archive_name_size) > 0xFFFFFFFF))
    return MZ_FALSE;

  if (!mz_zip_get_file_modified_time(pSrc_filename, &dos_time, &dos_date))
    return MZ_FALSE;

  pSrc_file = MZ_FOPEN(pSrc_filename, "rb");
  if (!pSrc_file)
    return MZ_FALSE;
  MZ_FSEEK64(pSrc_file, 0, SEEK_END);
  uncomp_size = MZ_FTELL64(pSrc_file);
  MZ_FSEEK64(pSrc_file, 0, SEEK_SET);

  if (uncomp_size > 0xFFFFFFFF) {
    // No zip64 support yet
    MZ_FCLOSE(pSrc_file);
    return MZ_FALSE;
  }
  if (uncomp_size <= 3)
    level = 0;

  if (!mz_zip_writer_write_zeros(pZip, cur_archive_file_ofs,
                                 num_alignment_padding_bytes +
                                     sizeof(local_dir_header))) {
    MZ_FCLOSE(pSrc_file);
    return MZ_FALSE;
  }
  local_dir_header_ofs += num_alignment_padding_bytes;
  if (pZip->m_file_offset_alignment) {
    MZ_ASSERT((local_dir_header_ofs & (pZip->m_file_offset_alignment - 1)) ==
              0);
  }
  cur_archive_file_ofs +=
      num_alignment_padding_bytes + sizeof(local_dir_header);

  MZ_CLEAR_OBJ(local_dir_header);
  if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, pArchive_name,
                     archive_name_size) != archive_name_size) {
    MZ_FCLOSE(pSrc_file);
    return MZ_FALSE;
  }
  cur_archive_file_ofs += archive_name_size;

  if (uncomp_size) {
    mz_uint64 uncomp_remaining = uncomp_size;
    void *pRead_buf =
        pZip->m_pAlloc(pZip->m_pAlloc_opaque, 1, MZ_ZIP_MAX_IO_BUF_SIZE);
    if (!pRead_buf) {
      MZ_FCLOSE(pSrc_file);
      return MZ_FALSE;
    }

    if (!level) {
      while (uncomp_remaining) {
        mz_uint n = (mz_uint)MZ_MIN(MZ_ZIP_MAX_IO_BUF_SIZE, uncomp_remaining);
        if ((MZ_FREAD(pRead_buf, 1, n, pSrc_file) != n) ||
            (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, pRead_buf,
                            n) != n)) {
          pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
          MZ_FCLOSE(pSrc_file);
          return MZ_FALSE;
        }
        uncomp_crc32 =
            (mz_uint32)mz_crc32(uncomp_crc32, (const mz_uint8 *)pRead_buf, n);
        uncomp_remaining -= n;
        cur_archive_file_ofs += n;
      }
      comp_size = uncomp_size;
    } else {
      mz_bool result = MZ_FALSE;
      mz_zip_writer_add_state state;
      tdefl_compressor *pComp = (tdefl_compressor *)pZip->m_pAlloc(
          pZip->m_pAlloc_opaque, 1, sizeof(tdefl_compressor));
      if (!pComp) {
        pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
        MZ_FCLOSE(pSrc_file);
        return MZ_FALSE;
      }

      state.m_pZip = pZip;
      state.m_cur_archive_file_ofs = cur_archive_file_ofs;
      state.m_comp_size = 0;

      if (tdefl_init(pComp, mz_zip_writer_add_put_buf_callback, &state,
                     tdefl_create_comp_flags_from_zip_params(
                         level, -15, MZ_DEFAULT_STRATEGY)) !=
          TDEFL_STATUS_OKAY) {
        pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
        pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
        MZ_FCLOSE(pSrc_file);
        return MZ_FALSE;
      }

      for (;;) {
        size_t in_buf_size =
            (mz_uint32)MZ_MIN(uncomp_remaining, MZ_ZIP_MAX_IO_BUF_SIZE);
        tdefl_status status;

        if (MZ_FREAD(pRead_buf, 1, in_buf_size, pSrc_file) != in_buf_size)
          break;

        uncomp_crc32 = (mz_uint32)mz_crc32(
            uncomp_crc32, (const mz_uint8 *)pRead_buf, in_buf_size);
        uncomp_remaining -= in_buf_size;

        status = tdefl_compress_buffer(pComp, pRead_buf, in_buf_size,
                                       uncomp_remaining ? TDEFL_NO_FLUSH
                                                        : TDEFL_FINISH);
        if (status == TDEFL_STATUS_DONE) {
          result = MZ_TRUE;
          break;
        } else if (status != TDEFL_STATUS_OKAY)
          break;
      }

      pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);

      if (!result) {
        pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
        MZ_FCLOSE(pSrc_file);
        return MZ_FALSE;
      }

      comp_size = state.m_comp_size;
      cur_archive_file_ofs = state.m_cur_archive_file_ofs;

      method = MZ_DEFLATED;
    }

    pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
  }

  MZ_FCLOSE(pSrc_file);
  pSrc_file = NULL;

  // no zip64 support yet
  if ((comp_size > 0xFFFFFFFF) || (cur_archive_file_ofs > 0xFFFFFFFF))
    return MZ_FALSE;

  if (!mz_zip_writer_create_local_dir_header(
          pZip, local_dir_header, (mz_uint16)archive_name_size, 0, uncomp_size,
          comp_size, uncomp_crc32, method, 0, dos_time, dos_date))
    return MZ_FALSE;

  if (pZip->m_pWrite(pZip->m_pIO_opaque, local_dir_header_ofs, local_dir_header,
                     sizeof(local_dir_header)) != sizeof(local_dir_header))
    return MZ_FALSE;

  if (!mz_zip_writer_add_to_central_dir(
          pZip, pArchive_name, (mz_uint16)archive_name_size, NULL, 0, pComment,
          comment_size, uncomp_size, comp_size, uncomp_crc32, method, 0,
          dos_time, dos_date, local_dir_header_ofs, ext_attributes))
    return MZ_FALSE;

  pZip->m_total_files++;
  pZip->m_archive_size = cur_archive_file_ofs;

  return MZ_TRUE;
}